

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

void __thiscall Proxy::Proxy(Proxy *this,string path,bool _randomize_credentials)

{
  long lVar1;
  long lVar2;
  bool in_DL;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CService::CService(&this->proxy);
  (this->m_unix_socket_path)._M_dataplus._M_p = (pointer)&(this->m_unix_socket_path).field_2;
  lVar2 = *(long *)CONCAT71(in_register_00000031,_randomize_credentials);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_unix_socket_path,lVar2,
             ((long *)CONCAT71(in_register_00000031,_randomize_credentials))[1] + lVar2);
  this->m_is_unix_socket = true;
  this->m_randomize_credentials = in_DL;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Proxy(const std::string path, bool _randomize_credentials = false) : m_unix_socket_path(path), m_is_unix_socket(true), m_randomize_credentials(_randomize_credentials) {}